

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative_entropy.c
# Opt level: O0

double inform_relative_entropy(int *xs,int *ys,size_t n,int b,inform_error *err)

{
  _Bool _Var1;
  int *piVar2;
  double re;
  inform_dist *y;
  inform_dist *x;
  inform_error *err_local;
  size_t sStack_28;
  int b_local;
  size_t n_local;
  int *ys_local;
  int *xs_local;
  
  x = (inform_dist *)err;
  err_local._4_4_ = b;
  sStack_28 = n;
  n_local = (size_t)ys;
  ys_local = xs;
  _Var1 = check_arguments(xs,ys,n,b,err);
  if (_Var1) {
    xs_local = (int *)0x7ff8000000000000;
  }
  else {
    y = (inform_dist *)0x0;
    re = 0.0;
    _Var1 = allocate(err_local._4_4_,&y,(inform_dist **)&re,(inform_error *)x);
    if (_Var1) {
      xs_local = (int *)0x7ff8000000000000;
    }
    else {
      accumulate(ys_local,(int *)n_local,sStack_28,y,(inform_dist *)re);
      piVar2 = (int *)inform_shannon_re(y,(inform_dist *)re,2.0);
      free_all(&y,(inform_dist **)&re);
      xs_local = piVar2;
    }
  }
  return (double)xs_local;
}

Assistant:

double inform_relative_entropy(int const *xs, int const *ys, size_t n, int b,
    inform_error *err)
{
    if (check_arguments(xs, ys, n, b, err)) return NAN;

    inform_dist *x = NULL, *y = NULL;
    if (allocate(b, &x, &y, err)) return NAN;

    accumulate(xs, ys, n, x, y);

    double re = inform_shannon_re(x, y, 2.0);

    free_all(&x, &y);

    return re;
}